

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Reader * __thiscall
kj::_::NullableValue<capnp::schema::Node::Reader>::emplace<capnp::schema::Node::Reader>
          (NullableValue<capnp::schema::Node::Reader> *this,Reader *params)

{
  Reader *params_00;
  Reader *params_local;
  NullableValue<capnp::schema::Node::Reader> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<capnp::schema::Node::Reader>(&(this->field_1).value);
  }
  params_00 = fwd<capnp::schema::Node::Reader>(params);
  ctor<capnp::schema::Node::Reader,capnp::schema::Node::Reader>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (Reader *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }